

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringlib.c
# Opt level: O2

stringlib_tokens_t * stringlib_splitTokens(char *str,char chr)

{
  stringlib_tokens_t *psVar1;
  s_stringlib_token *psVar2;
  stringlib_tokens_t *psVar3;
  s_stringlib_token *psVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  stringlib_tokens_t *psVar8;
  long lVar9;
  stringlib_tokens_t *local_38;
  
  lVar9 = 0;
  pcVar5 = str;
  pcVar6 = str;
  psVar8 = (stringlib_tokens_t *)0x0;
  for (pcVar7 = str + 1; pcVar7[-1] != '\0'; pcVar7 = pcVar7 + 1) {
    psVar3 = psVar8;
    if (pcVar7[-1] == chr) {
      psVar1 = (stringlib_tokens_t *)malloc(0x18);
      psVar1->next = (s_stringlib_token *)0x0;
      psVar3 = psVar1;
      if (psVar8 != (stringlib_tokens_t *)0x0) {
        local_38->next = psVar1;
        psVar3 = psVar8;
      }
      psVar1->start = (long)pcVar5 - (long)str;
      psVar1->length = (long)pcVar6 - (long)pcVar5;
      pcVar5 = pcVar7;
      local_38 = psVar1;
    }
    pcVar6 = pcVar6 + 1;
    lVar9 = lVar9 + -1;
    psVar8 = psVar3;
  }
  psVar4 = psVar8;
  if (lVar9 != 0) {
    psVar2 = (s_stringlib_token *)malloc(0x18);
    psVar2->next = (s_stringlib_token *)0x0;
    psVar4 = psVar2;
    if (psVar8 != (stringlib_tokens_t *)0x0) {
      local_38->next = psVar2;
      psVar4 = psVar8;
    }
    psVar2->start = (long)pcVar5 - (long)str;
    psVar2->length = (long)pcVar6 - (long)pcVar5;
  }
  return psVar4;
}

Assistant:

stringlib_tokens_t *stringlib_splitTokens(char *str, char chr) {
	char *lastPos;
	char *newPos;

	stringlib_tokens_t *tokens = NULL;
	stringlib_tokens_t *currentToken;
	stringlib_tokens_t *newToken;

	newPos = str;
	lastPos = str;

	while ( *newPos != '\0' ) {
		if ( *newPos == chr ) {
			newToken = (stringlib_tokens_t *) malloc(sizeof(stringlib_tokens_t));
			newToken->next = NULL;

			if ( tokens == NULL ) {
				tokens = newToken;
				currentToken = newToken;
			} else {
				currentToken->next = newToken;
				currentToken = newToken;
			}

			currentToken->start = ( lastPos - str );
			currentToken->length = ( newPos - lastPos );
			lastPos = newPos + 1;
		}
		newPos++;
	}
	if ( newPos != str ) {
		newToken = (stringlib_tokens_t *) malloc(sizeof(stringlib_tokens_t));
		newToken->next = NULL;

		if ( tokens == NULL ) {
			tokens = newToken;
			currentToken = newToken;
		} else {
			currentToken->next = newToken;
			currentToken = newToken;
		}

		currentToken->start = ( lastPos - str );
		currentToken->length = ( newPos - lastPos );
	}
	return tokens;
}